

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenizer_unittest.cc
# Opt level: O3

void __thiscall
google::protobuf::io::anon_unknown_0::TokenizerTest_ParseInteger_Test::TestBody
          (TokenizerTest_ParseInteger_Test *this)

{
  AssertHelperData *pAVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  bool bVar3;
  size_t sVar4;
  pointer *__ptr;
  int *piVar5;
  string *psVar6;
  char *pcVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar8;
  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pdVar9;
  pointer pcVar10;
  char *in_R9;
  ostream *poVar11;
  long lVar12;
  char octal [32];
  char decimal [32];
  char hex [32];
  uint64_t parsed_4;
  uint64_t i_1;
  uint64_t parsed;
  uint64_t parsed_2;
  uint64_t i;
  undefined1 local_e8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d8;
  string local_c8;
  undefined1 local_a8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_98;
  AssertHelper local_88;
  _Alloc_hider local_80;
  undefined1 local_78 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_68;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_50;
  AssertHelper local_48;
  uint64_t local_40;
  AssertHelper local_38;
  
  local_78 = (undefined1  [8])((ulong)local_78 & 0xffffffff00000000);
  paVar2 = &local_c8.field_2;
  psVar6 = (string *)0x12e80d7;
  local_c8._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"0","");
  local_a8 = (undefined1  [8])TokenizerTest::ParseInteger((TokenizerTest *)&local_c8,psVar6);
  testing::internal::CmpHelperEQ<int,unsigned_long>
            ((internal *)local_e8,"0","ParseInteger(\"0\")",(int *)local_78,
             (unsigned_long *)local_a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != paVar2) {
    operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
  }
  if (local_e8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_c8);
    if (local_e0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar7 = anon_var_dwarf_a22956 + 5;
    }
    else {
      pcVar7 = (local_e0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/tokenizer_unittest.cc"
               ,0x362,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_a8,(Message *)&local_c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_a8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      (**(code **)(*(size_type *)local_c8._M_dataplus._M_p + 8))();
    }
  }
  if (local_e0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_e0,local_e0);
  }
  local_78._0_4_ = 0x7b;
  psVar6 = (string *)0x1175e14;
  local_c8._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"123","");
  local_a8 = (undefined1  [8])TokenizerTest::ParseInteger((TokenizerTest *)&local_c8,psVar6);
  testing::internal::CmpHelperEQ<int,unsigned_long>
            ((internal *)local_e8,"123","ParseInteger(\"123\")",(int *)local_78,
             (unsigned_long *)local_a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != paVar2) {
    operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
  }
  if (local_e8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_c8);
    if (local_e0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar7 = anon_var_dwarf_a22956 + 5;
    }
    else {
      pcVar7 = (local_e0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/tokenizer_unittest.cc"
               ,0x363,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_a8,(Message *)&local_c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_a8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      (**(code **)(*(size_type *)local_c8._M_dataplus._M_p + 8))();
    }
  }
  if (local_e0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_e0,local_e0);
  }
  local_78._0_4_ = 0xabcdef12;
  pcVar7 = "0xabcdef12";
  local_c8._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"0xabcdef12","");
  local_a8 = (undefined1  [8])
             TokenizerTest::ParseInteger((TokenizerTest *)&local_c8,(string *)pcVar7);
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
            ((internal *)local_e8,"0xabcdef12u","ParseInteger(\"0xabcdef12\")",(uint *)local_78,
             (unsigned_long *)local_a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != paVar2) {
    operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
  }
  if (local_e8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_c8);
    if (local_e0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar7 = anon_var_dwarf_a22956 + 5;
    }
    else {
      pcVar7 = (local_e0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/tokenizer_unittest.cc"
               ,0x364,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_a8,(Message *)&local_c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_a8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      (**(code **)(*(size_type *)local_c8._M_dataplus._M_p + 8))();
    }
  }
  if (local_e0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_e0,local_e0);
  }
  local_78._0_4_ = 0xabcdef12;
  pcVar7 = "0xABCDEF12";
  local_c8._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"0xABCDEF12","");
  local_a8 = (undefined1  [8])
             TokenizerTest::ParseInteger((TokenizerTest *)&local_c8,(string *)pcVar7);
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
            ((internal *)local_e8,"0xabcdef12u","ParseInteger(\"0xABCDEF12\")",(uint *)local_78,
             (unsigned_long *)local_a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != paVar2) {
    operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
  }
  if (local_e8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_c8);
    if (local_e0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar7 = anon_var_dwarf_a22956 + 5;
    }
    else {
      pcVar7 = (local_e0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/tokenizer_unittest.cc"
               ,0x365,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_a8,(Message *)&local_c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_a8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      (**(code **)(*(size_type *)local_c8._M_dataplus._M_p + 8))();
    }
  }
  if (local_e0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_e0,local_e0);
  }
  pcVar7 = "0xFFFFFFFFFFFFFFFF";
  local_c8._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"0xFFFFFFFFFFFFFFFF","");
  local_a8 = (undefined1  [8])
             TokenizerTest::ParseInteger((TokenizerTest *)&local_c8,(string *)pcVar7);
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)local_e8,"kuint64max","ParseInteger(\"0xFFFFFFFFFFFFFFFF\")",&kuint64max,
             (unsigned_long *)local_a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != paVar2) {
    operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
  }
  if (local_e8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_c8);
    if (local_e0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar7 = anon_var_dwarf_a22956 + 5;
    }
    else {
      pcVar7 = (local_e0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/tokenizer_unittest.cc"
               ,0x366,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_a8,(Message *)&local_c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_a8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      (**(code **)(*(size_type *)local_c8._M_dataplus._M_p + 8))();
    }
  }
  if (local_e0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_e0,local_e0);
  }
  local_78._0_4_ = 0x53977;
  pcVar7 = "01234567";
  local_c8._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"01234567","");
  local_a8 = (undefined1  [8])
             TokenizerTest::ParseInteger((TokenizerTest *)&local_c8,(string *)pcVar7);
  testing::internal::CmpHelperEQ<int,unsigned_long>
            ((internal *)local_e8,"01234567","ParseInteger(\"01234567\")",(int *)local_78,
             (unsigned_long *)local_a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != paVar2) {
    operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
  }
  if (local_e8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_c8);
    if (local_e0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar7 = anon_var_dwarf_a22956 + 5;
    }
    else {
      pcVar7 = (local_e0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/tokenizer_unittest.cc"
               ,0x367,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_a8,(Message *)&local_c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_a8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      (**(code **)(*(size_type *)local_c8._M_dataplus._M_p + 8))();
    }
  }
  if (local_e0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_e0,local_e0);
  }
  local_78._0_4_ = 0x123;
  pcVar7 = "0X123";
  local_c8._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"0X123","");
  local_a8 = (undefined1  [8])
             TokenizerTest::ParseInteger((TokenizerTest *)&local_c8,(string *)pcVar7);
  testing::internal::CmpHelperEQ<int,unsigned_long>
            ((internal *)local_e8,"0X123","ParseInteger(\"0X123\")",(int *)local_78,
             (unsigned_long *)local_a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != paVar2) {
    operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
  }
  if (local_e8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_c8);
    if (local_e0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar7 = anon_var_dwarf_a22956 + 5;
    }
    else {
      pcVar7 = (local_e0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/tokenizer_unittest.cc"
               ,0x368,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_a8,(Message *)&local_c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_a8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      (**(code **)(*(size_type *)local_c8._M_dataplus._M_p + 8))();
    }
  }
  if (local_e0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_e0,local_e0);
  }
  local_78 = (undefined1  [8])((ulong)local_78 & 0xffffffff00000000);
  psVar6 = (string *)0x1430012;
  local_c8._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"0x","");
  local_a8 = (undefined1  [8])TokenizerTest::ParseInteger((TokenizerTest *)&local_c8,psVar6);
  testing::internal::CmpHelperEQ<int,unsigned_long>
            ((internal *)local_e8,"0","ParseInteger(\"0x\")",(int *)local_78,
             (unsigned_long *)local_a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != paVar2) {
    operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
  }
  if (local_e8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_c8);
    if (local_e0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar7 = anon_var_dwarf_a22956 + 5;
    }
    else {
      pcVar7 = (local_e0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/tokenizer_unittest.cc"
               ,0x36b,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_a8,(Message *)&local_c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_a8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      (**(code **)(*(size_type *)local_c8._M_dataplus._M_p + 8))();
    }
  }
  if (local_e0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_e0,local_e0);
  }
  local_c8._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"zxy","");
  bVar3 = Tokenizer::ParseInteger(&local_c8,0xffffffffffffffff,&local_40);
  local_e8[0] = (internal)!bVar3;
  local_e0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p == paVar2) {
    if (bVar3) goto LAB_00b2cd41;
  }
  else {
    operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
    if (((ulong)local_e8 & 1) == 0) {
LAB_00b2cd41:
      testing::Message::Message((Message *)local_a8);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_c8,(internal *)local_e8,
                 (AssertionResult *)"Tokenizer::ParseInteger(\"zxy\", kuint64max, &i)","true",
                 "false",in_R9);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)local_78,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/tokenizer_unittest.cc"
                 ,0x370,local_c8._M_dataplus._M_p);
      testing::internal::AssertHelper::operator=((AssertHelper *)local_78,(Message *)local_a8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_78);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8._M_dataplus._M_p != paVar2) {
        operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
      }
      if (local_a8 != (undefined1  [8])0x0) {
        (**(code **)(*(size_type *)local_a8 + 8))();
      }
    }
  }
  if (local_e0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_e0,local_e0);
  }
  local_c8._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"1.2","");
  bVar3 = Tokenizer::ParseInteger(&local_c8,0xffffffffffffffff,&local_40);
  local_e8[0] = (internal)!bVar3;
  local_e0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p == paVar2) {
    if (bVar3) goto LAB_00b2ce51;
  }
  else {
    operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
    if (((ulong)local_e8 & 1) == 0) {
LAB_00b2ce51:
      testing::Message::Message((Message *)local_a8);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_c8,(internal *)local_e8,
                 (AssertionResult *)"Tokenizer::ParseInteger(\"1.2\", kuint64max, &i)","true",
                 "false",in_R9);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)local_78,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/tokenizer_unittest.cc"
                 ,0x371,local_c8._M_dataplus._M_p);
      testing::internal::AssertHelper::operator=((AssertHelper *)local_78,(Message *)local_a8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_78);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8._M_dataplus._M_p != paVar2) {
        operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
      }
      if (local_a8 != (undefined1  [8])0x0) {
        (**(code **)(*(size_type *)local_a8 + 8))();
      }
    }
  }
  if (local_e0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_e0,local_e0);
  }
  local_c8._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"08","");
  bVar3 = Tokenizer::ParseInteger(&local_c8,0xffffffffffffffff,&local_40);
  local_e8[0] = (internal)!bVar3;
  local_e0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p == paVar2) {
    if (bVar3) goto LAB_00b2cf61;
  }
  else {
    operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
    if (((ulong)local_e8 & 1) == 0) {
LAB_00b2cf61:
      testing::Message::Message((Message *)local_a8);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_c8,(internal *)local_e8,
                 (AssertionResult *)"Tokenizer::ParseInteger(\"08\", kuint64max, &i)","true","false"
                 ,in_R9);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)local_78,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/tokenizer_unittest.cc"
                 ,0x372,local_c8._M_dataplus._M_p);
      testing::internal::AssertHelper::operator=((AssertHelper *)local_78,(Message *)local_a8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_78);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8._M_dataplus._M_p != paVar2) {
        operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
      }
      if (local_a8 != (undefined1  [8])0x0) {
        (**(code **)(*(size_type *)local_a8 + 8))();
      }
    }
  }
  if (local_e0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_e0,local_e0);
  }
  local_c8._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"0xg","");
  bVar3 = Tokenizer::ParseInteger(&local_c8,0xffffffffffffffff,&local_40);
  local_e8[0] = (internal)!bVar3;
  local_e0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p == paVar2) {
    if (bVar3) goto LAB_00b2d071;
  }
  else {
    operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
    if (((ulong)local_e8 & 1) == 0) {
LAB_00b2d071:
      testing::Message::Message((Message *)local_a8);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_c8,(internal *)local_e8,
                 (AssertionResult *)"Tokenizer::ParseInteger(\"0xg\", kuint64max, &i)","true",
                 "false",in_R9);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)local_78,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/tokenizer_unittest.cc"
                 ,0x373,local_c8._M_dataplus._M_p);
      testing::internal::AssertHelper::operator=((AssertHelper *)local_78,(Message *)local_a8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_78);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8._M_dataplus._M_p != paVar2) {
        operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
      }
      if (local_a8 != (undefined1  [8])0x0) {
        (**(code **)(*(size_type *)local_a8 + 8))();
      }
    }
  }
  if (local_e0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_e0,local_e0);
  }
  local_c8._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"-1","");
  bVar3 = Tokenizer::ParseInteger(&local_c8,0xffffffffffffffff,&local_40);
  local_e8[0] = (internal)!bVar3;
  local_e0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p == paVar2) {
    if (bVar3) goto LAB_00b2d181;
  }
  else {
    operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
    if (((ulong)local_e8 & 1) == 0) {
LAB_00b2d181:
      testing::Message::Message((Message *)local_a8);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_c8,(internal *)local_e8,
                 (AssertionResult *)"Tokenizer::ParseInteger(\"-1\", kuint64max, &i)","true","false"
                 ,in_R9);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)local_78,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/tokenizer_unittest.cc"
                 ,0x374,local_c8._M_dataplus._M_p);
      testing::internal::AssertHelper::operator=((AssertHelper *)local_78,(Message *)local_a8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_78);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8._M_dataplus._M_p != paVar2) {
        operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
      }
      if (local_a8 != (undefined1  [8])0x0) {
        (**(code **)(*(size_type *)local_a8 + 8))();
      }
    }
  }
  if (local_e0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_e0,local_e0);
  }
  local_c8._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"0","");
  bVar3 = Tokenizer::ParseInteger(&local_c8,0,&local_40);
  local_e8[0] = (internal)bVar3;
  local_e0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p == paVar2) {
    if (!bVar3) goto LAB_00b2d287;
  }
  else {
    operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
    if (((ulong)local_e8 & 1) == 0) {
LAB_00b2d287:
      testing::Message::Message((Message *)local_a8);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_c8,(internal *)local_e8,
                 (AssertionResult *)"Tokenizer::ParseInteger(\"0\", 0, &i)","false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)local_78,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/tokenizer_unittest.cc"
                 ,0x377,local_c8._M_dataplus._M_p);
      testing::internal::AssertHelper::operator=((AssertHelper *)local_78,(Message *)local_a8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_78);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8._M_dataplus._M_p != paVar2) {
        operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
      }
      if (local_a8 != (undefined1  [8])0x0) {
        (**(code **)(*(size_type *)local_a8 + 8))();
      }
    }
  }
  if (local_e0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_e0,local_e0);
  }
  local_c8._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"1","");
  bVar3 = Tokenizer::ParseInteger(&local_c8,0,&local_40);
  local_e8[0] = (internal)!bVar3;
  local_e0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p == paVar2) {
    if (bVar3) goto LAB_00b2d392;
  }
  else {
    operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
    if (((ulong)local_e8 & 1) == 0) {
LAB_00b2d392:
      testing::Message::Message((Message *)local_a8);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_c8,(internal *)local_e8,
                 (AssertionResult *)"Tokenizer::ParseInteger(\"1\", 0, &i)","true","false",in_R9);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)local_78,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/tokenizer_unittest.cc"
                 ,0x378,local_c8._M_dataplus._M_p);
      testing::internal::AssertHelper::operator=((AssertHelper *)local_78,(Message *)local_a8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_78);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8._M_dataplus._M_p != paVar2) {
        operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
      }
      if (local_a8 != (undefined1  [8])0x0) {
        (**(code **)(*(size_type *)local_a8 + 8))();
      }
    }
  }
  if (local_e0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_e0,local_e0);
  }
  local_c8._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"1","");
  bVar3 = Tokenizer::ParseInteger(&local_c8,1,&local_40);
  local_e8[0] = (internal)bVar3;
  local_e0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p == paVar2) {
    if (!bVar3) goto LAB_00b2d49b;
  }
  else {
    operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
    if (((ulong)local_e8 & 1) == 0) {
LAB_00b2d49b:
      testing::Message::Message((Message *)local_a8);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_c8,(internal *)local_e8,
                 (AssertionResult *)"Tokenizer::ParseInteger(\"1\", 1, &i)","false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)local_78,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/tokenizer_unittest.cc"
                 ,0x379,local_c8._M_dataplus._M_p);
      testing::internal::AssertHelper::operator=((AssertHelper *)local_78,(Message *)local_a8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_78);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8._M_dataplus._M_p != paVar2) {
        operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
      }
      if (local_a8 != (undefined1  [8])0x0) {
        (**(code **)(*(size_type *)local_a8 + 8))();
      }
    }
  }
  if (local_e0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_e0,local_e0);
  }
  local_c8._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"12345","");
  bVar3 = Tokenizer::ParseInteger(&local_c8,0x3039,&local_40);
  local_e8[0] = (internal)bVar3;
  local_e0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p == paVar2) {
    if (!bVar3) goto LAB_00b2d5a4;
  }
  else {
    operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
    if (((ulong)local_e8 & 1) == 0) {
LAB_00b2d5a4:
      testing::Message::Message((Message *)local_a8);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_c8,(internal *)local_e8,
                 (AssertionResult *)"Tokenizer::ParseInteger(\"12345\", 12345, &i)","false","true",
                 in_R9);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)local_78,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/tokenizer_unittest.cc"
                 ,0x37a,local_c8._M_dataplus._M_p);
      testing::internal::AssertHelper::operator=((AssertHelper *)local_78,(Message *)local_a8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_78);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8._M_dataplus._M_p != paVar2) {
        operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
      }
      if (local_a8 != (undefined1  [8])0x0) {
        (**(code **)(*(size_type *)local_a8 + 8))();
      }
    }
  }
  if (local_e0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_e0,local_e0);
  }
  local_c8._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"12346","");
  bVar3 = Tokenizer::ParseInteger(&local_c8,0x3039,&local_40);
  local_e8[0] = (internal)!bVar3;
  local_e0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p == paVar2) {
    if (bVar3) goto LAB_00b2d6b2;
  }
  else {
    operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
    if (((ulong)local_e8 & 1) == 0) {
LAB_00b2d6b2:
      testing::Message::Message((Message *)local_a8);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_c8,(internal *)local_e8,
                 (AssertionResult *)"Tokenizer::ParseInteger(\"12346\", 12345, &i)","true","false",
                 in_R9);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)local_78,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/tokenizer_unittest.cc"
                 ,0x37b,local_c8._M_dataplus._M_p);
      testing::internal::AssertHelper::operator=((AssertHelper *)local_78,(Message *)local_a8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_78);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8._M_dataplus._M_p != paVar2) {
        operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
      }
      if (local_a8 != (undefined1  [8])0x0) {
        (**(code **)(*(size_type *)local_a8 + 8))();
      }
    }
  }
  if (local_e0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_e0,local_e0);
  }
  local_c8._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"0xFFFFFFFFFFFFFFFF","");
  bVar3 = Tokenizer::ParseInteger(&local_c8,0xffffffffffffffff,&local_40);
  local_e8[0] = (internal)bVar3;
  local_e0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p == paVar2) {
    if (!bVar3) goto LAB_00b2d7bd;
  }
  else {
    operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
    if (((ulong)local_e8 & 1) == 0) {
LAB_00b2d7bd:
      testing::Message::Message((Message *)local_a8);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_c8,(internal *)local_e8,
                 (AssertionResult *)
                 "Tokenizer::ParseInteger(\"0xFFFFFFFFFFFFFFFF\", kuint64max, &i)","false","true",
                 in_R9);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)local_78,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/tokenizer_unittest.cc"
                 ,0x37c,local_c8._M_dataplus._M_p);
      testing::internal::AssertHelper::operator=((AssertHelper *)local_78,(Message *)local_a8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_78);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8._M_dataplus._M_p != paVar2) {
        operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
      }
      if (local_a8 != (undefined1  [8])0x0) {
        (**(code **)(*(size_type *)local_a8 + 8))();
      }
    }
  }
  if (local_e0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_e0,local_e0);
  }
  local_c8._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"0x10000000000000000","");
  bVar3 = Tokenizer::ParseInteger(&local_c8,0xffffffffffffffff,&local_40);
  local_e8[0] = (internal)!bVar3;
  local_e0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p == paVar2) {
    if (!bVar3) goto LAB_00b2d959;
  }
  else {
    operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
    if (((ulong)local_e8 & 1) != 0) goto LAB_00b2d959;
  }
  testing::Message::Message((Message *)local_a8);
  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
            (&local_c8,(internal *)local_e8,
             (AssertionResult *)"Tokenizer::ParseInteger(\"0x10000000000000000\", kuint64max, &i)",
             "true","false",in_R9);
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)local_78,kNonFatalFailure,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/tokenizer_unittest.cc"
             ,0x37d,local_c8._M_dataplus._M_p);
  testing::internal::AssertHelper::operator=((AssertHelper *)local_78,(Message *)local_a8);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_78);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != paVar2) {
    operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
  }
  if (local_a8 != (undefined1  [8])0x0) {
    (**(code **)(*(size_type *)local_a8 + 8))();
  }
LAB_00b2d959:
  if (local_e0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_e0,local_e0);
  }
  lVar12 = 0;
  do {
    local_80._M_p = (pointer)(lVar12 + 0x7ffffffffffff9bf);
    snprintf((char *)&local_c8,0x20,"%llu");
    if (lVar12 == 0x640 || lVar12 + -0x640 < 0) {
      local_78 = (undefined1  [8])0xffffffffffffffff;
      local_e8 = (undefined1  [8])&local_d8;
      sVar4 = strlen((char *)&local_c8);
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_e8,&local_c8,(long)&local_c8._M_dataplus._M_p + sVar4);
      bVar3 = Tokenizer::ParseInteger((string *)local_e8,0x7fffffffffffffff,(uint64_t *)local_78);
      local_a8[0] = (internal)bVar3;
      local_a0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if (local_e8 == (undefined1  [8])&local_d8) {
        if (!bVar3) goto LAB_00b2df63;
      }
      else {
        operator_delete((void *)local_e8,local_d8._M_allocated_capacity + 1);
        if (((ulong)local_a8 & 1) == 0) {
LAB_00b2df63:
          testing::Message::Message((Message *)&local_58);
          poVar11 = (ostream *)(local_58._M_head_impl + 0x10);
          sVar4 = strlen((char *)&local_c8);
          std::__ostream_insert<char,std::char_traits<char>>(poVar11,(char *)&local_c8,sVar4);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)(local_58._M_head_impl + 0x10),"=>",2);
          std::ostream::_M_insert<unsigned_long>((ulong)(local_58._M_head_impl + 0x10));
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)local_e8,(internal *)local_a8,
                     (AssertionResult *)"Tokenizer::ParseInteger(decimal, kint64max, &parsed)",
                     "false","true",in_R9);
          testing::internal::AssertHelper::AssertHelper
                    (&local_88,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/tokenizer_unittest.cc"
                     ,0x38c,(char *)local_e8);
          testing::internal::AssertHelper::operator=(&local_88,(Message *)&local_58);
          testing::internal::AssertHelper::~AssertHelper(&local_88);
          if (local_e8 != (undefined1  [8])&local_d8) {
            operator_delete((void *)local_e8,local_d8._M_allocated_capacity + 1);
          }
          if (local_58._M_head_impl !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            (**(code **)(*(long *)local_58._M_head_impl + 8))();
          }
        }
      }
      if (local_a0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_a0,local_a0);
      }
      testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
                ((internal *)local_e8,"parsed","i",(unsigned_long *)local_78,
                 (unsigned_long *)&local_80);
      if (local_e8[0] == (internal)0x0) {
        testing::Message::Message((Message *)local_a8);
        pcVar10 = anon_var_dwarf_a22956 + 5;
        if (local_e0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar10 = (local_e0->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_58,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/tokenizer_unittest.cc"
                   ,0x38e,pcVar10);
        testing::internal::AssertHelper::operator=((AssertHelper *)&local_58,(Message *)local_a8);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_58);
        if (local_a8 != (undefined1  [8])0x0) {
          (**(code **)(*(long *)local_a8 + 8))();
        }
      }
      if (local_e0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_e0,local_e0);
      }
      snprintf(local_e8,0x20,"0%llo",local_80._M_p);
      local_58._M_head_impl =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           0xffffffffffffffff;
      local_a8 = (undefined1  [8])&local_98;
      sVar4 = strlen(local_e8);
      std::__cxx11::string::_M_construct<char_const*>((string *)local_a8,local_e8,local_e8 + sVar4);
      bVar3 = Tokenizer::ParseInteger((string *)local_a8,0x7fffffffffffffff,(uint64_t *)&local_58);
      local_78[0] = (internal)bVar3;
      local_70 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if (local_a8 == (undefined1  [8])&local_98) {
        if (!bVar3) goto LAB_00b2e1b2;
      }
      else {
        operator_delete((void *)local_a8,local_98._M_allocated_capacity + 1);
        if (((ulong)local_78 & 1) == 0) {
LAB_00b2e1b2:
          testing::Message::Message((Message *)&local_88);
          piVar5 = &(local_88.data_)->line;
          sVar4 = strlen(local_e8);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)piVar5,local_e8,sVar4);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&(local_88.data_)->line,"=>",2);
          std::ostream::_M_insert<unsigned_long>((ulong)&(local_88.data_)->line);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)local_a8,(internal *)local_78,
                     (AssertionResult *)"Tokenizer::ParseInteger(octal, kint64max, &parsed)","false"
                     ,"true",in_R9);
          testing::internal::AssertHelper::AssertHelper
                    (&local_48,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/tokenizer_unittest.cc"
                     ,0x398,(char *)local_a8);
          testing::internal::AssertHelper::operator=(&local_48,(Message *)&local_88);
          testing::internal::AssertHelper::~AssertHelper(&local_48);
          if (local_a8 != (undefined1  [8])&local_98) {
            operator_delete((void *)local_a8,local_98._M_allocated_capacity + 1);
          }
          if (local_88.data_ != (AssertHelperData *)0x0) {
            (**(code **)(*(long *)local_88.data_ + 8))();
          }
        }
      }
      if (local_70 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_70,local_70);
      }
      testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
                ((internal *)local_a8,"parsed","i",(unsigned_long *)&local_58,
                 (unsigned_long *)&local_80);
      if (local_a8[0] == (internal)0x0) {
        testing::Message::Message((Message *)local_78);
        pcVar7 = anon_var_dwarf_a22956 + 5;
        if (local_a0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar7 = (local_a0->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_88,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/tokenizer_unittest.cc"
                   ,0x39a,pcVar7);
        testing::internal::AssertHelper::operator=(&local_88,(Message *)local_78);
        testing::internal::AssertHelper::~AssertHelper(&local_88);
        if (local_78 != (undefined1  [8])0x0) {
          (**(code **)(*(long *)local_78 + 8))();
        }
      }
      if (local_a0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_a0,local_a0);
      }
      snprintf(local_a8,0x20,"0x%llx",local_80._M_p);
      local_88.data_ = (AssertHelperData *)0xffffffffffffffff;
      local_78 = (undefined1  [8])&local_68;
      sVar4 = strlen(local_a8);
      std::__cxx11::string::_M_construct<char_const*>((string *)local_78,local_a8,local_a8 + sVar4);
      bVar3 = Tokenizer::ParseInteger((string *)local_78,0x7fffffffffffffff,(uint64_t *)&local_88);
      local_58._M_head_impl._0_1_ = bVar3;
      local_50 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if (local_78 == (undefined1  [8])&local_68) {
        if (!bVar3) goto LAB_00b2e405;
      }
      else {
        operator_delete((void *)local_78,local_68._0_8_ + 1);
        if (((ulong)local_58._M_head_impl & 1) == 0) {
LAB_00b2e405:
          testing::Message::Message((Message *)&local_48);
          piVar5 = &(local_48.data_)->line;
          sVar4 = strlen(local_a8);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)piVar5,local_a8,sVar4);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)local_78,(internal *)&local_58,
                     (AssertionResult *)"Tokenizer::ParseInteger(hex, kint64max, &parsed)","false",
                     "true",in_R9);
          testing::internal::AssertHelper::AssertHelper
                    (&local_38,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/tokenizer_unittest.cc"
                     ,0x3a4,(char *)local_78);
          testing::internal::AssertHelper::operator=(&local_38,(Message *)&local_48);
          testing::internal::AssertHelper::~AssertHelper(&local_38);
          if (local_78 != (undefined1  [8])&local_68) {
            operator_delete((void *)local_78,local_68._0_8_ + 1);
          }
          if (local_48.data_ != (AssertHelperData *)0x0) {
            (**(code **)(*(long *)local_48.data_ + 8))();
          }
        }
      }
      if (local_50 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_50,local_50);
      }
      testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
                ((internal *)local_78,"parsed","i",(unsigned_long *)&local_88,
                 (unsigned_long *)&local_80);
      if (local_78[0] == (internal)0x0) {
        testing::Message::Message((Message *)&local_58);
        pcVar10 = anon_var_dwarf_a22956 + 5;
        if (local_70 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar10 = (local_70->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_48,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/tokenizer_unittest.cc"
                   ,0x3a5,pcVar10);
        testing::internal::AssertHelper::operator=(&local_48,(Message *)&local_58);
        testing::internal::AssertHelper::~AssertHelper(&local_48);
        if (local_58._M_head_impl !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          (**(code **)(*(long *)local_58._M_head_impl + 8))();
        }
      }
      if (local_70 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pdVar9 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_70;
        pbVar8 = local_70;
        goto LAB_00b2e59a;
      }
    }
    else {
      local_78 = (undefined1  [8])0xffffffffffffffff;
      local_e8 = (undefined1  [8])&local_d8;
      sVar4 = strlen((char *)&local_c8);
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_e8,&local_c8,(long)&local_c8._M_dataplus._M_p + sVar4);
      bVar3 = Tokenizer::ParseInteger((string *)local_e8,0x7fffffffffffffff,(uint64_t *)local_78);
      local_a8[0] = (internal)!bVar3;
      local_a0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if (local_e8 == (undefined1  [8])&local_d8) {
        if (bVar3) goto LAB_00b2daca;
      }
      else {
        operator_delete((void *)local_e8,local_d8._M_allocated_capacity + 1);
        if (((ulong)local_a8 & 1) == 0) {
LAB_00b2daca:
          testing::Message::Message((Message *)&local_58);
          poVar11 = (ostream *)(local_58._M_head_impl + 0x10);
          sVar4 = strlen((char *)&local_c8);
          std::__ostream_insert<char,std::char_traits<char>>(poVar11,(char *)&local_c8,sVar4);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)(local_58._M_head_impl + 0x10),"=>",2);
          std::ostream::_M_insert<unsigned_long>((ulong)(local_58._M_head_impl + 0x10));
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)local_e8,(internal *)local_a8,
                     (AssertionResult *)"Tokenizer::ParseInteger(decimal, kint64max, &parsed)",
                     "true","false",in_R9);
          testing::internal::AssertHelper::AssertHelper
                    (&local_88,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/tokenizer_unittest.cc"
                     ,0x388,(char *)local_e8);
          testing::internal::AssertHelper::operator=(&local_88,(Message *)&local_58);
          testing::internal::AssertHelper::~AssertHelper(&local_88);
          if (local_e8 != (undefined1  [8])&local_d8) {
            operator_delete((void *)local_e8,local_d8._M_allocated_capacity + 1);
          }
          if (local_58._M_head_impl !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            (**(code **)(*(long *)local_58._M_head_impl + 8))();
          }
        }
      }
      if (local_a0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_a0,local_a0);
      }
      snprintf(local_e8,0x20,"0%llo",local_80._M_p);
      local_58._M_head_impl =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           0xffffffffffffffff;
      local_a8 = (undefined1  [8])&local_98;
      sVar4 = strlen(local_e8);
      std::__cxx11::string::_M_construct<char_const*>((string *)local_a8,local_e8,local_e8 + sVar4);
      bVar3 = Tokenizer::ParseInteger((string *)local_a8,0x7fffffffffffffff,(uint64_t *)&local_58);
      local_78[0] = (internal)!bVar3;
      local_70 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if (local_a8 == (undefined1  [8])&local_98) {
        if (bVar3) goto LAB_00b2dc7d;
      }
      else {
        operator_delete((void *)local_a8,local_98._M_allocated_capacity + 1);
        if (((ulong)local_78 & 1) == 0) {
LAB_00b2dc7d:
          testing::Message::Message((Message *)&local_88);
          piVar5 = &(local_88.data_)->line;
          sVar4 = strlen(local_e8);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)piVar5,local_e8,sVar4);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&(local_88.data_)->line,"=>",2);
          std::ostream::_M_insert<unsigned_long>((ulong)&(local_88.data_)->line);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)local_a8,(internal *)local_78,
                     (AssertionResult *)"Tokenizer::ParseInteger(octal, kint64max, &parsed)","true",
                     "false",in_R9);
          testing::internal::AssertHelper::AssertHelper
                    (&local_48,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/tokenizer_unittest.cc"
                     ,0x394,(char *)local_a8);
          testing::internal::AssertHelper::operator=(&local_48,(Message *)&local_88);
          testing::internal::AssertHelper::~AssertHelper(&local_48);
          if (local_a8 != (undefined1  [8])&local_98) {
            operator_delete((void *)local_a8,local_98._M_allocated_capacity + 1);
          }
          if (local_88.data_ != (AssertHelperData *)0x0) {
            (**(code **)(*(long *)local_88.data_ + 8))();
          }
        }
      }
      if (local_70 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_70,local_70);
      }
      snprintf(local_a8,0x20,"0x%llx",local_80._M_p);
      local_88.data_ = (AssertHelperData *)0xffffffffffffffff;
      local_78 = (undefined1  [8])&local_68;
      sVar4 = strlen(local_a8);
      std::__cxx11::string::_M_construct<char_const*>((string *)local_78,local_a8,local_a8 + sVar4);
      bVar3 = Tokenizer::ParseInteger((string *)local_78,0x7fffffffffffffff,(uint64_t *)&local_88);
      local_58._M_head_impl._0_1_ = !bVar3;
      local_50 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if (local_78 == (undefined1  [8])&local_68) {
        if (bVar3) goto LAB_00b2de34;
      }
      else {
        operator_delete((void *)local_78,local_68._0_8_ + 1);
        if (((ulong)local_58._M_head_impl & 1) == 0) {
LAB_00b2de34:
          testing::Message::Message((Message *)&local_48);
          piVar5 = &(local_48.data_)->line;
          sVar4 = strlen(local_a8);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)piVar5,local_a8,sVar4);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&(local_48.data_)->line,"=>",2);
          std::ostream::_M_insert<unsigned_long>((ulong)&(local_48.data_)->line);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)local_78,(internal *)&local_58,
                     (AssertionResult *)"Tokenizer::ParseInteger(hex, kint64max, &parsed)","true",
                     "false",in_R9);
          testing::internal::AssertHelper::AssertHelper
                    (&local_38,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/tokenizer_unittest.cc"
                     ,0x3a0,(char *)local_78);
          testing::internal::AssertHelper::operator=(&local_38,(Message *)&local_48);
          testing::internal::AssertHelper::~AssertHelper(&local_38);
          if (local_78 != (undefined1  [8])&local_68) {
            operator_delete((void *)local_78,local_68._0_8_ + 1);
          }
          if (local_48.data_ != (AssertHelperData *)0x0) {
            (**(code **)(*(long *)local_48.data_ + 8))();
          }
        }
      }
      if (local_50 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pdVar9 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_50;
        pbVar8 = local_50;
LAB_00b2e59a:
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()(pdVar9,pbVar8);
      }
    }
    lVar12 = lVar12 + 1;
  } while (lVar12 != 0xc81);
  lVar12 = 0xf;
  do {
    pAVar1 = (AssertHelperData *)(lVar12 + -0x650);
    local_78 = (undefined1  [8])pAVar1;
    snprintf((char *)&local_c8,0x20,"1844674407370955%04llu",lVar12);
    if (lVar12 == 0x64f || lVar12 + -0x64f < 0) {
      local_58._M_head_impl =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           0xffffffffffffffff;
      local_e8 = (undefined1  [8])&local_d8;
      sVar4 = strlen((char *)&local_c8);
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_e8,&local_c8,(long)&local_c8._M_dataplus._M_p + sVar4);
      bVar3 = Tokenizer::ParseInteger((string *)local_e8,0xffffffffffffffff,(uint64_t *)&local_58);
      local_a8[0] = (internal)bVar3;
      local_a0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if (local_e8 == (undefined1  [8])&local_d8) {
        if (!bVar3) goto LAB_00b2eb28;
      }
      else {
        operator_delete((void *)local_e8,local_d8._M_allocated_capacity + 1);
        if (((ulong)local_a8 & 1) == 0) {
LAB_00b2eb28:
          testing::Message::Message((Message *)&local_80);
          poVar11 = (ostream *)(local_80._M_p + 0x10);
          sVar4 = strlen((char *)&local_c8);
          std::__ostream_insert<char,std::char_traits<char>>(poVar11,(char *)&local_c8,sVar4);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)local_e8,(internal *)local_a8,
                     (AssertionResult *)"Tokenizer::ParseInteger(decimal, kuint64max, &parsed)",
                     "false","true",in_R9);
          testing::internal::AssertHelper::AssertHelper
                    (&local_88,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/tokenizer_unittest.cc"
                     ,0x3bb,(char *)local_e8);
          testing::internal::AssertHelper::operator=(&local_88,(Message *)&local_80);
          testing::internal::AssertHelper::~AssertHelper(&local_88);
          if (local_e8 != (undefined1  [8])&local_d8) {
            operator_delete((void *)local_e8,local_d8._M_allocated_capacity + 1);
          }
          if ((long *)local_80._M_p != (long *)0x0) {
            (**(code **)(*(long *)local_80._M_p + 8))();
          }
        }
      }
      if (local_a0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_a0,local_a0);
      }
      testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
                ((internal *)local_e8,"parsed","i",(unsigned_long *)&local_58,
                 (unsigned_long *)local_78);
      if (local_e8[0] == (internal)0x0) {
        testing::Message::Message((Message *)local_a8);
        pcVar10 = anon_var_dwarf_a22956 + 5;
        if (local_e0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar10 = (local_e0->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_80,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/tokenizer_unittest.cc"
                   ,0x3bd,pcVar10);
        testing::internal::AssertHelper::operator=((AssertHelper *)&local_80,(Message *)local_a8);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_80);
        if (local_a8 != (undefined1  [8])0x0) {
          (**(code **)(*(long *)local_a8 + 8))();
        }
      }
      if (local_e0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_e0,local_e0);
      }
      local_78 = (undefined1  [8])pAVar1;
      snprintf((char *)&local_c8,0x20,"0%llo",pAVar1);
      local_58._M_head_impl =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           0xffffffffffffffff;
      local_e8 = (undefined1  [8])&local_d8;
      sVar4 = strlen((char *)&local_c8);
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_e8,&local_c8,(long)&local_c8._M_dataplus._M_p + sVar4);
      bVar3 = Tokenizer::ParseInteger((string *)local_e8,0xffffffffffffffff,(uint64_t *)&local_58);
      local_a8[0] = (internal)bVar3;
      local_a0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if (local_e8 == (undefined1  [8])&local_d8) {
        if (!bVar3) goto LAB_00b2ed22;
      }
      else {
        operator_delete((void *)local_e8,local_d8._M_allocated_capacity + 1);
        if (((ulong)local_a8 & 1) == 0) {
LAB_00b2ed22:
          testing::Message::Message((Message *)&local_80);
          poVar11 = (ostream *)(local_80._M_p + 0x10);
          sVar4 = strlen((char *)&local_c8);
          std::__ostream_insert<char,std::char_traits<char>>(poVar11,(char *)&local_c8,sVar4);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)local_e8,(internal *)local_a8,
                     (AssertionResult *)"Tokenizer::ParseInteger(octal, kuint64max, &parsed)",
                     "false","true",in_R9);
          testing::internal::AssertHelper::AssertHelper
                    (&local_88,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/tokenizer_unittest.cc"
                     ,0x3cd,(char *)local_e8);
          testing::internal::AssertHelper::operator=(&local_88,(Message *)&local_80);
          testing::internal::AssertHelper::~AssertHelper(&local_88);
          if (local_e8 != (undefined1  [8])&local_d8) {
            operator_delete((void *)local_e8,local_d8._M_allocated_capacity + 1);
          }
          if ((long *)local_80._M_p != (long *)0x0) {
            (**(code **)(*(long *)local_80._M_p + 8))();
          }
        }
      }
      if (local_a0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_a0,local_a0);
      }
      testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
                ((internal *)local_e8,"parsed","i",(unsigned_long *)&local_58,
                 (unsigned_long *)local_78);
      if (local_e8[0] == (internal)0x0) {
        testing::Message::Message((Message *)local_a8);
        pcVar7 = anon_var_dwarf_a22956 + 5;
        if (local_e0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar7 = (local_e0->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_80,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/tokenizer_unittest.cc"
                   ,0x3cf,pcVar7);
        testing::internal::AssertHelper::operator=((AssertHelper *)&local_80,(Message *)local_a8);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_80);
        if (local_a8 != (undefined1  [8])0x0) {
          (**(code **)(*(long *)local_a8 + 8))();
        }
      }
      if (local_e0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_e0,local_e0);
      }
      local_78 = (undefined1  [8])pAVar1;
      snprintf((char *)&local_c8,0x20,"0x%llx",pAVar1);
      local_58._M_head_impl =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           0xffffffffffffffff;
      local_e8 = (undefined1  [8])&local_d8;
      sVar4 = strlen((char *)&local_c8);
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_e8,&local_c8,(long)&local_c8._M_dataplus._M_p + sVar4);
      bVar3 = Tokenizer::ParseInteger((string *)local_e8,0xffffffffffffffff,(uint64_t *)&local_58);
      local_a8[0] = (internal)bVar3;
      local_a0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if (local_e8 == (undefined1  [8])&local_d8) {
        if (!bVar3) goto LAB_00b2ef1c;
      }
      else {
        operator_delete((void *)local_e8,local_d8._M_allocated_capacity + 1);
        if (((ulong)local_a8 & 1) == 0) {
LAB_00b2ef1c:
          testing::Message::Message((Message *)&local_80);
          poVar11 = (ostream *)(local_80._M_p + 0x10);
          sVar4 = strlen((char *)&local_c8);
          std::__ostream_insert<char,std::char_traits<char>>(poVar11,(char *)&local_c8,sVar4);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)local_e8,(internal *)local_a8,
                     (AssertionResult *)"Tokenizer::ParseInteger(hex, kuint64max, &parsed)","false",
                     "true",in_R9);
          testing::internal::AssertHelper::AssertHelper
                    (&local_88,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/tokenizer_unittest.cc"
                     ,0x3de,(char *)local_e8);
          testing::internal::AssertHelper::operator=(&local_88,(Message *)&local_80);
          testing::internal::AssertHelper::~AssertHelper(&local_88);
          if (local_e8 != (undefined1  [8])&local_d8) {
            operator_delete((void *)local_e8,local_d8._M_allocated_capacity + 1);
          }
          if ((long *)local_80._M_p != (long *)0x0) {
            (**(code **)(*(long *)local_80._M_p + 8))();
          }
        }
      }
      if (local_a0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_a0,local_a0);
      }
      testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
                ((internal *)local_e8,"parsed","ui",(unsigned_long *)&local_58,
                 (unsigned_long *)local_78);
      if (local_e8[0] == (internal)0x0) {
        testing::Message::Message((Message *)local_a8);
        pcVar10 = anon_var_dwarf_a22956 + 5;
        if (local_e0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar10 = (local_e0->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_80,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/tokenizer_unittest.cc"
                   ,0x3df,pcVar10);
        testing::internal::AssertHelper::operator=((AssertHelper *)&local_80,(Message *)local_a8);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_80);
        if (local_a8 != (undefined1  [8])0x0) {
          (**(code **)(*(size_type *)local_a8 + 8))();
        }
      }
      if (local_e0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pdVar9 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_e0;
        pbVar8 = local_e0;
        goto LAB_00b2f06d;
      }
    }
    else {
      local_58._M_head_impl =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           0xffffffffffffffff;
      local_e8 = (undefined1  [8])&local_d8;
      sVar4 = strlen((char *)&local_c8);
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_e8,&local_c8,(long)&local_c8._M_dataplus._M_p + sVar4);
      bVar3 = Tokenizer::ParseInteger((string *)local_e8,0xffffffffffffffff,(uint64_t *)&local_58);
      local_a8[0] = (internal)!bVar3;
      local_a0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if (local_e8 == (undefined1  [8])&local_d8) {
        if (bVar3) goto LAB_00b2e709;
      }
      else {
        operator_delete((void *)local_e8,local_d8._M_allocated_capacity + 1);
        if (((ulong)local_a8 & 1) == 0) {
LAB_00b2e709:
          testing::Message::Message((Message *)&local_80);
          poVar11 = (ostream *)(local_80._M_p + 0x10);
          sVar4 = strlen((char *)&local_c8);
          std::__ostream_insert<char,std::char_traits<char>>(poVar11,(char *)&local_c8,sVar4);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)(local_80._M_p + 0x10),"=>",2);
          std::ostream::_M_insert<unsigned_long>((ulong)(local_80._M_p + 0x10));
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)local_e8,(internal *)local_a8,
                     (AssertionResult *)"Tokenizer::ParseInteger(decimal, kuint64max, &parsed)",
                     "true","false",in_R9);
          testing::internal::AssertHelper::AssertHelper
                    (&local_88,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/tokenizer_unittest.cc"
                     ,0x3b7,(char *)local_e8);
          testing::internal::AssertHelper::operator=(&local_88,(Message *)&local_80);
          testing::internal::AssertHelper::~AssertHelper(&local_88);
          if (local_e8 != (undefined1  [8])&local_d8) {
            operator_delete((void *)local_e8,local_d8._M_allocated_capacity + 1);
          }
          if ((long *)local_80._M_p != (long *)0x0) {
            (**(code **)(*(long *)local_80._M_p + 8))();
          }
        }
      }
      if (local_a0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_a0,local_a0);
      }
      local_78 = (undefined1  [8])pAVar1;
      snprintf((char *)&local_c8,0x20,"0200000000000000000%04llo",pAVar1);
      local_58._M_head_impl =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           0xffffffffffffffff;
      local_e8 = (undefined1  [8])&local_d8;
      sVar4 = strlen((char *)&local_c8);
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_e8,&local_c8,(long)&local_c8._M_dataplus._M_p + sVar4);
      bVar3 = Tokenizer::ParseInteger((string *)local_e8,0xffffffffffffffff,(uint64_t *)&local_58);
      local_a8[0] = (internal)!bVar3;
      local_a0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if (local_e8 == (undefined1  [8])&local_d8) {
        if (bVar3) goto LAB_00b2e89c;
      }
      else {
        operator_delete((void *)local_e8,local_d8._M_allocated_capacity + 1);
        if (((ulong)local_a8 & 1) == 0) {
LAB_00b2e89c:
          testing::Message::Message((Message *)&local_80);
          poVar11 = (ostream *)(local_80._M_p + 0x10);
          sVar4 = strlen((char *)&local_c8);
          std::__ostream_insert<char,std::char_traits<char>>(poVar11,(char *)&local_c8,sVar4);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)(local_80._M_p + 0x10),"=>",2);
          std::ostream::_M_insert<unsigned_long>((ulong)(local_80._M_p + 0x10));
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)local_e8,(internal *)local_a8,
                     (AssertionResult *)"Tokenizer::ParseInteger(octal, kuint64max, &parsed)","true"
                     ,"false",in_R9);
          testing::internal::AssertHelper::AssertHelper
                    (&local_88,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/tokenizer_unittest.cc"
                     ,0x3c7,(char *)local_e8);
          testing::internal::AssertHelper::operator=(&local_88,(Message *)&local_80);
          testing::internal::AssertHelper::~AssertHelper(&local_88);
          if (local_e8 != (undefined1  [8])&local_d8) {
            operator_delete((void *)local_e8,local_d8._M_allocated_capacity + 1);
          }
          if ((long *)local_80._M_p != (long *)0x0) {
            (**(code **)(*(long *)local_80._M_p + 8))();
          }
        }
      }
      if (local_a0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_a0,local_a0);
      }
      local_78 = (undefined1  [8])pAVar1;
      snprintf((char *)&local_c8,0x20,"0x1000000000000%04llx",pAVar1);
      local_58._M_head_impl =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           0xffffffffffffffff;
      local_e8 = (undefined1  [8])&local_d8;
      sVar4 = strlen((char *)&local_c8);
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_e8,&local_c8,(long)&local_c8._M_dataplus._M_p + sVar4);
      bVar3 = Tokenizer::ParseInteger((string *)local_e8,0xffffffffffffffff,(uint64_t *)&local_58);
      local_a8[0] = (internal)!bVar3;
      local_a0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if (local_e8 == (undefined1  [8])&local_d8) {
        if (bVar3) goto LAB_00b2ea2f;
      }
      else {
        operator_delete((void *)local_e8,local_d8._M_allocated_capacity + 1);
        if (((ulong)local_a8 & 1) == 0) {
LAB_00b2ea2f:
          testing::Message::Message((Message *)&local_80);
          poVar11 = (ostream *)(local_80._M_p + 0x10);
          sVar4 = strlen((char *)&local_c8);
          std::__ostream_insert<char,std::char_traits<char>>(poVar11,(char *)&local_c8,sVar4);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)(local_80._M_p + 0x10),"=>",2);
          std::ostream::_M_insert<unsigned_long>((ulong)(local_80._M_p + 0x10));
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)local_e8,(internal *)local_a8,
                     (AssertionResult *)"Tokenizer::ParseInteger(hex, kuint64max, &parsed)","true",
                     "false",in_R9);
          testing::internal::AssertHelper::AssertHelper
                    (&local_88,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/tokenizer_unittest.cc"
                     ,0x3d9,(char *)local_e8);
          testing::internal::AssertHelper::operator=(&local_88,(Message *)&local_80);
          testing::internal::AssertHelper::~AssertHelper(&local_88);
          if (local_e8 != (undefined1  [8])&local_d8) {
            operator_delete((void *)local_e8,local_d8._M_allocated_capacity + 1);
          }
          if ((long *)local_80._M_p != (long *)0x0) {
            (**(code **)(*(long *)local_80._M_p + 8))();
          }
        }
      }
      if (local_a0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pdVar9 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_a0;
        pbVar8 = local_a0;
LAB_00b2f06d:
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()(pdVar9,pbVar8);
      }
    }
    lVar12 = lVar12 + 1;
    if (lVar12 == 0xc90) {
      return;
    }
  } while( true );
}

Assistant:

TEST_F(TokenizerTest, ParseInteger) {
  EXPECT_EQ(0, ParseInteger("0"));
  EXPECT_EQ(123, ParseInteger("123"));
  EXPECT_EQ(0xabcdef12u, ParseInteger("0xabcdef12"));
  EXPECT_EQ(0xabcdef12u, ParseInteger("0xABCDEF12"));
  EXPECT_EQ(kuint64max, ParseInteger("0xFFFFFFFFFFFFFFFF"));
  EXPECT_EQ(01234567, ParseInteger("01234567"));
  EXPECT_EQ(0X123, ParseInteger("0X123"));

  // Test invalid integers that may still be tokenized as integers.
  EXPECT_EQ(0, ParseInteger("0x"));

  uint64_t i;

  // Test invalid integers that will never be tokenized as integers.
  EXPECT_FALSE(Tokenizer::ParseInteger("zxy", kuint64max, &i));
  EXPECT_FALSE(Tokenizer::ParseInteger("1.2", kuint64max, &i));
  EXPECT_FALSE(Tokenizer::ParseInteger("08", kuint64max, &i));
  EXPECT_FALSE(Tokenizer::ParseInteger("0xg", kuint64max, &i));
  EXPECT_FALSE(Tokenizer::ParseInteger("-1", kuint64max, &i));

  // Test overflows.
  EXPECT_TRUE(Tokenizer::ParseInteger("0", 0, &i));
  EXPECT_FALSE(Tokenizer::ParseInteger("1", 0, &i));
  EXPECT_TRUE(Tokenizer::ParseInteger("1", 1, &i));
  EXPECT_TRUE(Tokenizer::ParseInteger("12345", 12345, &i));
  EXPECT_FALSE(Tokenizer::ParseInteger("12346", 12345, &i));
  EXPECT_TRUE(Tokenizer::ParseInteger("0xFFFFFFFFFFFFFFFF", kuint64max, &i));
  EXPECT_FALSE(Tokenizer::ParseInteger("0x10000000000000000", kuint64max, &i));

  // Test near the limits of signed parsing (values in kint64max +/- 1600)
  for (int64_t offset = -1600; offset <= 1600; ++offset) {
    // We make sure to perform an unsigned addition so that we avoid signed
    // overflow, which would be undefined behavior.
    uint64_t i = 0x7FFFFFFFFFFFFFFFu + static_cast<uint64_t>(offset);
    char decimal[32];
    snprintf(decimal, 32, "%llu", static_cast<unsigned long long>(i));
    if (offset > 0) {
      uint64_t parsed = -1;
      EXPECT_FALSE(Tokenizer::ParseInteger(decimal, kint64max, &parsed))
          << decimal << "=>" << parsed;
    } else {
      uint64_t parsed = -1;
      EXPECT_TRUE(Tokenizer::ParseInteger(decimal, kint64max, &parsed))
          << decimal << "=>" << parsed;
      EXPECT_EQ(parsed, i);
    }
    char octal[32];
    snprintf(octal, 32, "0%llo", static_cast<unsigned long long>(i));
    if (offset > 0) {
      uint64_t parsed = -1;
      EXPECT_FALSE(Tokenizer::ParseInteger(octal, kint64max, &parsed))
          << octal << "=>" << parsed;
    } else {
      uint64_t parsed = -1;
      EXPECT_TRUE(Tokenizer::ParseInteger(octal, kint64max, &parsed))
          << octal << "=>" << parsed;
      EXPECT_EQ(parsed, i);
    }
    char hex[32];
    snprintf(hex, 32, "0x%llx", static_cast<unsigned long long>(i));
    if (offset > 0) {
      uint64_t parsed = -1;
      EXPECT_FALSE(Tokenizer::ParseInteger(hex, kint64max, &parsed))
          << hex << "=>" << parsed;
    } else {
      uint64_t parsed = -1;
      EXPECT_TRUE(Tokenizer::ParseInteger(hex, kint64max, &parsed)) << hex;
      EXPECT_EQ(parsed, i);
    }
    // EXPECT_NE(offset, -237);
  }

  // Test near the limits of unsigned parsing (values in kuint64max +/- 1600)
  // By definition, values greater than kuint64max cannot be held in a uint64_t
  // variable, so printing them is a little tricky; fortunately all but the
  // last four digits are known, so we can hard-code them in the printf string,
  // and we only need to format the last 4.
  for (int64_t offset = -1600; offset <= 1600; ++offset) {
    {
      uint64_t i = 18446744073709551615u + offset;
      char decimal[32];
      snprintf(decimal, 32, "1844674407370955%04llu",
               static_cast<unsigned long long>(1615 + offset));
      if (offset > 0) {
        uint64_t parsed = -1;
        EXPECT_FALSE(Tokenizer::ParseInteger(decimal, kuint64max, &parsed))
            << decimal << "=>" << parsed;
      } else {
        uint64_t parsed = -1;
        EXPECT_TRUE(Tokenizer::ParseInteger(decimal, kuint64max, &parsed))
            << decimal;
        EXPECT_EQ(parsed, i);
      }
    }
    {
      uint64_t i = 01777777777777777777777u + offset;
      if (offset > 0) {
        char octal[32];
        snprintf(octal, 32, "0200000000000000000%04llo",
                 static_cast<unsigned long long>(offset - 1));
        uint64_t parsed = -1;
        EXPECT_FALSE(Tokenizer::ParseInteger(octal, kuint64max, &parsed))
            << octal << "=>" << parsed;
      } else {
        char octal[32];
        snprintf(octal, 32, "0%llo", static_cast<unsigned long long>(i));
        uint64_t parsed = -1;
        EXPECT_TRUE(Tokenizer::ParseInteger(octal, kuint64max, &parsed))
            << octal;
        EXPECT_EQ(parsed, i);
      }
    }
    {
      uint64_t ui = 0xffffffffffffffffu + offset;
      char hex[32];
      if (offset > 0) {
        snprintf(hex, 32, "0x1000000000000%04llx",
                 static_cast<unsigned long long>(offset - 1));
        uint64_t parsed = -1;
        EXPECT_FALSE(Tokenizer::ParseInteger(hex, kuint64max, &parsed))
            << hex << "=>" << parsed;
      } else {
        snprintf(hex, 32, "0x%llx", static_cast<unsigned long long>(ui));
        uint64_t parsed = -1;
        EXPECT_TRUE(Tokenizer::ParseInteger(hex, kuint64max, &parsed)) << hex;
        EXPECT_EQ(parsed, ui);
      }
    }
  }
}